

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reorganize.cpp
# Opt level: O2

size_t __thiscall
adios2::utils::Reorganize::Decompose(Reorganize *this,int numproc,int rank,VarInfo *vi,int *np)

{
  long lVar1;
  VarInfo *pVVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  size_t sVar6;
  int iVar7;
  VariableBase *pVVar8;
  size_type __n;
  long lVar9;
  size_t i;
  ulong uVar10;
  size_t count;
  VarInfo *local_b0;
  Reorganize *local_a8;
  Dims *local_a0;
  Dims *local_98;
  size_t start;
  string ints;
  vector<int,_std::allocator<int>_> pos;
  string local_50;
  
  pVVar8 = vi->v;
  if (pVVar8 != (VariableBase *)0x0) {
    if (*(int *)(pVVar8 + 0x40) != 5) {
      local_b0 = vi;
      adios2::core::VariableBase::Shape((ulong)&ints);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&ints);
      if ((pointer)ints._M_string_length != ints._M_dataplus._M_p) {
        __n = (long)(ints._M_string_length - (long)ints._M_dataplus._M_p) >> 3;
        std::vector<int,_std::allocator<int>_>::vector(&pos,__n,(allocator_type *)&ints);
        pVVar2 = local_b0;
        local_98 = &local_b0->start;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_98,__n);
        local_a0 = &pVVar2->count;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_a0,__n);
        sVar5 = 1;
        iVar7 = 1;
        while( true ) {
          iVar3 = (int)((long)rank / (long)iVar7);
          if (__n == sVar5) break;
          pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [sVar5 - 1] = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 |
                                    (long)rank / (long)iVar7 & 0xffffffffU) % (long)np[sVar5 - 1]);
          iVar7 = iVar7 * np[sVar5 - 1];
          sVar5 = sVar5 + 1;
        }
        pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [__n - 1] = iVar3;
        VectorToString<std::vector<int,std::allocator<int>>>(&ints,this,&pos);
        local_a8 = this;
        if (pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[__n - 1] < np[__n - 1]) {
          poVar4 = std::operator<<((ostream *)&std::cout,"rank ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,rank);
          poVar4 = std::operator<<(poVar4,": position in ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,"-D decomposition = ");
          poVar4 = std::operator<<(poVar4,(string *)&ints);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"rank ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,rank);
          poVar4 = std::operator<<(poVar4,": position in ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,"-D decomposition = ");
          poVar4 = std::operator<<(poVar4,(string *)&ints);
          poVar4 = std::operator<<(poVar4," ---> Out of bound process");
        }
        std::endl<char,std::char_traits<char>>(poVar4);
        sVar6 = 1;
        for (sVar5 = 0; __n != sVar5; sVar5 = sVar5 + 1) {
          if (pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[__n - 1] < np[__n - 1]) {
            adios2::core::VariableBase::Shape((ulong)&local_50);
            count = *(ulong *)(local_50._M_dataplus._M_p + sVar5 * 8) / (ulong)(long)np[sVar5];
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
            start = (long)pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar5] * count;
            if (pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[sVar5] == np[sVar5] + -1) {
              adios2::core::VariableBase::Shape((ulong)&local_50);
              count = *(long *)(local_50._M_dataplus._M_p + sVar5 * 8) -
                      ((long)np[sVar5] + -1) * count;
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_50);
            }
          }
          else {
            count = 0;
            start = 0;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_98,&start);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_a0,&count);
          sVar6 = sVar6 * count;
        }
        VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_50,local_a8,local_a0);
        std::__cxx11::string::operator=((string *)&ints,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = std::operator<<((ostream *)&std::cout,"rank ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,rank);
        poVar4 = std::operator<<(poVar4,": ldims in ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"-D space = {");
        poVar4 = std::operator<<(poVar4,(string *)&ints);
        poVar4 = std::operator<<(poVar4,"}");
        std::endl<char,std::char_traits<char>>(poVar4);
        VectorToString<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_50,local_a8,local_98);
        std::__cxx11::string::operator=((string *)&ints,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar4 = std::operator<<((ostream *)&std::cout,"rank ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,rank);
        poVar4 = std::operator<<(poVar4,": offsets in ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,"-D space = {");
        poVar4 = std::operator<<(poVar4,(string *)&ints);
        poVar4 = std::operator<<(poVar4,"}");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)&ints);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&pos.super__Vector_base<int,_std::allocator<int>_>);
        return sVar6;
      }
      return (ulong)(rank == 0);
    }
    if (rank == 0) {
      sVar6 = 1;
      lVar9 = 0;
      for (uVar10 = 0; lVar1 = *(long *)(pVVar8 + 0x88),
          uVar10 < (ulong)(*(long *)(pVVar8 + 0x90) - lVar1 >> 3); uVar10 = uVar10 + 1) {
        sVar6 = sVar6 * *(long *)(lVar1 + lVar9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&vi->count,(value_type_conflict *)(lVar1 + lVar9));
        pVVar8 = vi->v;
        lVar9 = lVar9 + 8;
      }
      return sVar6;
    }
  }
  return 0;
}

Assistant:

size_t Reorganize::Decompose(int numproc, int rank, VarInfo &vi,
                             const int *np // number of processes in each dimension
)
{
    size_t writesize = 0;
    if (vi.v == nullptr)
    {
        return writesize;
    }

    /* Handle local array: only one block for now */
    if (vi.v->m_ShapeID == adios2::ShapeID::LocalArray)
    {
        if (rank == 0)
        {
            writesize = 1;
            for (size_t i = 0; i < vi.v->m_Count.size(); i++)
            {
                writesize *= vi.v->m_Count[i];
                // vi.start.push_back(0);
                vi.count.push_back(vi.v->m_Count[i]);
            }
        }
        else
        {
            writesize = 0;
        }
        return writesize;
    }

    size_t ndim = vi.v->Shape().size();

    /* Scalars */
    if (ndim == 0)
    {
        // scalars -> rank 0 writes them
        if (rank == 0)
            writesize = 1;
        else
            writesize = 0;
        return writesize;
    }

    /* Global Arrays */
    /* calculate this process' position in the n-dim space
    0 1 2
    3 4 5
    6 7 8

    for 1D:
    posx = rank/1             ! 1st dim: 0, 1, 2...,rank-1 are in the same X
    position

    for 2D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = rank/(npx)         ! 2nd dim: npx processes belong into one dim

    for 3D:
    posx = mod(rank, npx)     ! 1st dim: 0, npx, 2npx... are in the same X
    position
    posy = mod(rank/npx, npy) ! 2nd dim: (0, npx-1) have the same dim (so divide
    with npx first)
    posz = rank/(npx*npy)     ! 3rd dim: npx*npy processes belong into one dim
    */
    int nps = 1;
    std::vector<int> pos(ndim); // rank's position in each dimensions
    vi.start.reserve(ndim);
    vi.count.reserve(ndim);

    size_t i = 0;
    for (i = 0; i < ndim - 1; i++)
    {
        pos[i] = (rank / nps) % np[i];
        nps *= np[i];
    }
    pos[i] = rank / nps;

    std::string ints = VectorToString(pos);
    if (pos[ndim - 1] >= np[ndim - 1])
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << " ---> Out of bound process" << std::endl;
    }
    else
    {
        std::cout << "rank " << rank << ": position in " << ndim << "-D decomposition = " << ints
                  << std::endl;
    }

    /* Decompose each dimension according to the position */
    writesize = 1;
    for (i = 0; i < ndim; i++)
    {
        size_t start, count;
        if (pos[ndim - 1] >= np[ndim - 1])
        {
            // this process gets nothing to read
            count = 0;
            start = 0;
        }
        else
        {
            count = vi.v->Shape()[i] / np[i];
            start = count * pos[i];
            if (pos[i] == np[i] - 1)
            {
                // last one in the dimension may need to read more than the rest
                count = vi.v->Shape()[i] - count * (np[i] - 1);
            }
        }
        vi.start.push_back(start);
        vi.count.push_back(count);
        writesize *= count;
    }
    ints = VectorToString(vi.count);
    std::cout << "rank " << rank << ": ldims in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    ints = VectorToString(vi.start);
    std::cout << "rank " << rank << ": offsets in " << ndim << "-D space = {" << ints << "}"
              << std::endl;
    return writesize;
}